

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Palette.cpp
# Opt level: O2

void __thiscall
sfc::Palette::add_images
          (Palette *this,vector<sfc::Image,_std::allocator<sfc::Image>_> *palette_tiles)

{
  rgba_set_t *__x;
  uint uVar1;
  FILE *f;
  pointer puVar2;
  pointer puVar3;
  Subpalette *this_00;
  __normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_> _Var4
  ;
  runtime_error *this_01;
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v10::basic_format_context<fmt::v10::appender,_char>_>_2
  this_02;
  pointer pIVar5;
  pointer psVar6;
  string_view fmt;
  format_args args;
  rgba_t local_e4;
  Palette *local_e0;
  rgba_set_vec_t local_d8;
  rgba_t *local_b8;
  pointer local_b0;
  rgba_vec_t cv;
  pointer local_80;
  rgba_set_vec_t optimized;
  ulong local_50;
  
  local_d8.
  super__Vector_base<std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>,_std::allocator<std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_d8.
  super__Vector_base<std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>,_std::allocator<std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_d8.
  super__Vector_base<std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>,_std::allocator<std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_b0 = (palette_tiles->super__Vector_base<sfc::Image,_std::allocator<sfc::Image>_>)._M_impl.
             super__Vector_impl_data._M_finish;
  local_b8 = &this->_col0;
  local_e0 = this;
  for (pIVar5 = (palette_tiles->super__Vector_base<sfc::Image,_std::allocator<sfc::Image>_>)._M_impl
                .super__Vector_impl_data._M_start; pIVar5 != local_b0; pIVar5 = pIVar5 + 1) {
    __x = &pIVar5->_colors;
    std::
    _Rb_tree<unsigned_int,_unsigned_int,_std::_Identity<unsigned_int>,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>
    ::_Rb_tree((_Rb_tree<unsigned_int,_unsigned_int,_std::_Identity<unsigned_int>,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>
                *)&optimized,&__x->_M_t);
    uVar1 = local_e0->_max_colors_per_subpalette;
    std::
    _Rb_tree<unsigned_int,_unsigned_int,_std::_Identity<unsigned_int>,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>
    ::~_Rb_tree((_Rb_tree<unsigned_int,_unsigned_int,_std::_Identity<unsigned_int>,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>
                 *)&optimized);
    this = local_e0;
    f = _stderr;
    if (uVar1 < local_50) {
      std::
      _Rb_tree<unsigned_int,_unsigned_int,_std::_Identity<unsigned_int>,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>
      ::_Rb_tree((_Rb_tree<unsigned_int,_unsigned_int,_std::_Identity<unsigned_int>,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>
                  *)&cv,&__x->_M_t);
      optimized.
      super__Vector_base<std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>,_std::allocator<std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage =
           (pointer)(ulong)this->_max_colors_per_subpalette;
      optimized.
      super__Vector_base<std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>,_std::allocator<std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start = local_80;
      fmt.size_ = 0x46;
      fmt.data_ = "  Tile with too many ({} > {}) unique colors at {},{} in source image\n";
      args.field_1.values_ =
           (value<fmt::v10::basic_format_context<fmt::v10::appender,_char>_> *)&optimized;
      args.desc_ = 0x2224;
      ::fmt::v10::vprint(f,fmt,args);
      std::
      _Rb_tree<unsigned_int,_unsigned_int,_std::_Identity<unsigned_int>,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>
      ::~_Rb_tree((_Rb_tree<unsigned_int,_unsigned_int,_std::_Identity<unsigned_int>,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>
                   *)&cv);
    }
    if (this->_col0_is_shared == true) {
      std::
      _Rb_tree<unsigned_int,_unsigned_int,_std::_Identity<unsigned_int>,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>
      ::_Rb_tree((_Rb_tree<unsigned_int,_unsigned_int,_std::_Identity<unsigned_int>,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>
                  *)&optimized,&__x->_M_t);
      std::
      _Rb_tree<unsigned_int,unsigned_int,std::_Identity<unsigned_int>,std::less<unsigned_int>,std::allocator<unsigned_int>>
      ::_M_insert_unique<unsigned_int_const&>
                ((_Rb_tree<unsigned_int,unsigned_int,std::_Identity<unsigned_int>,std::less<unsigned_int>,std::allocator<unsigned_int>>
                  *)&optimized,local_b8);
      reduce_colors((rgba_set_t *)&cv,(rgba_set_t *)&optimized,this->_mode);
      std::
      vector<std::set<unsigned_int,std::less<unsigned_int>,std::allocator<unsigned_int>>,std::allocator<std::set<unsigned_int,std::less<unsigned_int>,std::allocator<unsigned_int>>>>
      ::emplace_back<std::set<unsigned_int,std::less<unsigned_int>,std::allocator<unsigned_int>>>
                ((vector<std::set<unsigned_int,std::less<unsigned_int>,std::allocator<unsigned_int>>,std::allocator<std::set<unsigned_int,std::less<unsigned_int>,std::allocator<unsigned_int>>>>
                  *)&local_d8,
                 (set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_> *)&cv);
      std::
      _Rb_tree<unsigned_int,_unsigned_int,_std::_Identity<unsigned_int>,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>
      ::~_Rb_tree((_Rb_tree<unsigned_int,_unsigned_int,_std::_Identity<unsigned_int>,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>
                   *)&cv);
      this_02.values_ =
           (value<fmt::v10::basic_format_context<fmt::v10::appender,_char>_> *)&optimized;
    }
    else {
      std::
      _Rb_tree<unsigned_int,_unsigned_int,_std::_Identity<unsigned_int>,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>
      ::_Rb_tree((_Rb_tree<unsigned_int,_unsigned_int,_std::_Identity<unsigned_int>,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>
                  *)&cv,&__x->_M_t);
      reduce_colors((rgba_set_t *)&optimized,(rgba_set_t *)&cv,this->_mode);
      std::
      vector<std::set<unsigned_int,std::less<unsigned_int>,std::allocator<unsigned_int>>,std::allocator<std::set<unsigned_int,std::less<unsigned_int>,std::allocator<unsigned_int>>>>
      ::emplace_back<std::set<unsigned_int,std::less<unsigned_int>,std::allocator<unsigned_int>>>
                ((vector<std::set<unsigned_int,std::less<unsigned_int>,std::allocator<unsigned_int>>,std::allocator<std::set<unsigned_int,std::less<unsigned_int>,std::allocator<unsigned_int>>>>
                  *)&local_d8,
                 (set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_> *)
                 &optimized);
      std::
      _Rb_tree<unsigned_int,_unsigned_int,_std::_Identity<unsigned_int>,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>
      ::~_Rb_tree((_Rb_tree<unsigned_int,_unsigned_int,_std::_Identity<unsigned_int>,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>
                   *)&optimized);
      this_02.values_ = (value<fmt::v10::basic_format_context<fmt::v10::appender,_char>_> *)&cv;
    }
    std::
    _Rb_tree<unsigned_int,_unsigned_int,_std::_Identity<unsigned_int>,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>
    ::~_Rb_tree((_Rb_tree<unsigned_int,_unsigned_int,_std::_Identity<unsigned_int>,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>
                 *)this_02.values_);
  }
  optimized_palettes(&optimized,this,&local_d8);
  if ((ulong)(((long)optimized.
                     super__Vector_base<std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>,_std::allocator<std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_finish -
              (long)optimized.
                    super__Vector_base<std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>,_std::allocator<std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start) / 0x30) <=
      (ulong)this->_max_subpalettes) {
    for (psVar6 = optimized.
                  super__Vector_base<std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>,_std::allocator<std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        psVar6 != optimized.
                  super__Vector_base<std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>,_std::allocator<std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish; psVar6 = psVar6 + 1) {
      this_00 = add_subpalette(this);
      std::vector<unsigned_int,std::allocator<unsigned_int>>::
      vector<std::_Rb_tree_const_iterator<unsigned_int>,void>
                ((vector<unsigned_int,std::allocator<unsigned_int>> *)&cv,
                 (psVar6->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left,
                 (_Rb_tree_const_iterator<unsigned_int>)
                 &(psVar6->_M_t)._M_impl.super__Rb_tree_header,(allocator_type *)&local_e4);
      puVar3 = cv.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
               super__Vector_impl_data._M_finish;
      puVar2 = cv.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
               super__Vector_impl_data._M_start;
      if (this->_col0_is_shared == true) {
        local_e4 = reduce_color(this->_col0,this->_mode);
        _Var4 = std::
                __find_if<__gnu_cxx::__normal_iterator<unsigned_int*,std::vector<unsigned_int,std::allocator<unsigned_int>>>,__gnu_cxx::__ops::_Iter_equals_val<unsigned_int_const>>
                          (puVar2,puVar3,&local_e4);
        this = local_e0;
        if (_Var4._M_current !=
            cv.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
            super__Vector_impl_data._M_finish) {
          uVar1 = *_Var4._M_current;
          *_Var4._M_current =
               *cv.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                super__Vector_impl_data._M_start;
          *cv.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
           super__Vector_impl_data._M_start = uVar1;
        }
      }
      Subpalette::add(this_00,&cv,false,false);
      std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base
                ((_Vector_base<unsigned_int,_std::allocator<unsigned_int>_> *)&cv);
    }
    std::
    vector<std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>,_std::allocator<std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>_>_>
    ::~vector(&optimized);
    std::
    vector<std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>,_std::allocator<std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>_>_>
    ::~vector(&local_d8);
    return;
  }
  this_01 = (runtime_error *)__cxa_allocate_exception(0x10);
  std::runtime_error::runtime_error
            (this_01,"Colors in image do not fit in available palettes. Aborting.");
  __cxa_throw(this_01,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

void Palette::add_images(std::vector<sfc::Image> palette_tiles) {

  // make vector of sets of all tiles' colors
  rgba_set_vec_t palettes = rgba_set_vec_t();
  for (const auto& c : palette_tiles) {

    if (c.colors().size() > _max_colors_per_subpalette) {
      fmt::print(stderr, "  Tile with too many ({} > {}) unique colors at {},{} in source image\n", c.colors().size(), _max_colors_per_subpalette, c.src_coord_x(), c.src_coord_y());
    }

    if (_col0_is_shared) {
      auto colors = c.colors();
      colors.insert(_col0);
      palettes.push_back(reduce_colors(colors, _mode));
    } else {
      palettes.push_back(reduce_colors(c.colors(), _mode));
    }
  }

  // optimize
  auto optimized = optimized_palettes(palettes);

  // TODO: if throw iterate all palette_tiles and report positions
  if (optimized.size() > _max_subpalettes)
    throw std::runtime_error("Colors in image do not fit in available palettes. Aborting.");

  // add subpalettes
  for (auto& cs : optimized) {
    auto& sp = add_subpalette();
    rgba_vec_t cv(cs.begin(), cs.end());

    if (_col0_is_shared) {
      auto p = std::find(cv.begin(), cv.end(), reduce_color(_col0, _mode));
      if (p != cv.end())
        std::iter_swap(p, cv.begin());
    }

    sp.add(cv);
  }
}